

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SzAr_DecodeFolder(CSzAr *p,UInt32 folderIndex,ILookInStream *inStream,UInt64 startPos,
                      Byte *outBuffer,size_t outSize,ISzAlloc *allocMain)

{
  Byte *pBVar1;
  size_t sVar2;
  UInt32 UVar3;
  UInt64 UVar4;
  Byte *local_108;
  Byte *tempBuf [3];
  uint local_e4;
  uint i;
  Byte *data;
  CSzData sd;
  CSzFolder folder;
  SRes res;
  size_t outSize_local;
  Byte *outBuffer_local;
  UInt64 startPos_local;
  ILookInStream *inStream_local;
  UInt32 folderIndex_local;
  CSzAr *p_local;
  
  pBVar1 = p->CodersData;
  sVar2 = p->FoCodersOffsets[folderIndex];
  sd.Data = (Byte *)(p->FoCodersOffsets[folderIndex + 1] - p->FoCodersOffsets[folderIndex]);
  data = pBVar1 + sVar2;
  p_local._4_4_ = SzGetNextFolderItem((CSzFolder *)&sd.Size,(CSzData *)&data);
  if (p_local._4_4_ == 0) {
    if (((sd.Data == (Byte *)0x0) && (folder.NumBonds == p->FoToMainUnpackSizeIndex[folderIndex]))
       && (UVar4 = SzAr_GetFolderUnpackSize(p,folderIndex), outSize == UVar4)) {
      memset(&local_108,0,0x18);
      folder.Coders[3]._12_4_ =
           SzFolder_Decode2((CSzFolder *)&sd.Size,pBVar1 + sVar2,
                            p->CoderUnpackSizes + p->FoToCoderUnpackSizes[folderIndex],
                            p->PackPositions + p->FoStartPackStreamIndex[folderIndex],inStream,
                            startPos,outBuffer,outSize,allocMain,&local_108);
      for (local_e4 = 0; local_e4 < 3; local_e4 = local_e4 + 1) {
        (*allocMain->Free)(allocMain,tempBuf[(ulong)local_e4 - 1]);
      }
      if (((folder.Coders[3]._12_4_ == 0) && ((p->FolderCRCs).Defs != (Byte *)0x0)) &&
         ((((uint)(p->FolderCRCs).Defs[folderIndex >> 3] & 0x80 >> ((byte)folderIndex & 7)) != 0 &&
          (UVar3 = CrcCalc(outBuffer,outSize), UVar3 != (p->FolderCRCs).Vals[folderIndex])))) {
        folder.Coders[3].NumStreams = '\x03';
        folder.Coders[3].PropsSize = '\0';
        folder.Coders[3]._14_2_ = 0;
      }
      p_local._4_1_ = folder.Coders[3].NumStreams;
      p_local._5_1_ = folder.Coders[3].PropsSize;
      p_local._6_2_ = folder.Coders[3]._14_2_;
    }
    else {
      p_local._4_4_ = 0xb;
    }
  }
  return p_local._4_4_;
}

Assistant:

static SRes SzAr_DecodeFolder(const CSzAr *p, UInt32 folderIndex,
    ILookInStream *inStream, UInt64 startPos,
    Byte *outBuffer, size_t outSize,
    ISzAlloc *allocMain)
{
  SRes res;
  CSzFolder folder;
  CSzData sd;
  
  const Byte *data = p->CodersData + p->FoCodersOffsets[folderIndex];
  sd.Data = data;
  sd.Size = p->FoCodersOffsets[folderIndex + 1] - p->FoCodersOffsets[folderIndex];
  
  res = SzGetNextFolderItem(&folder, &sd);
  
  if (res != SZ_OK)
    return res;

  if (sd.Size != 0
      || folder.UnpackStream != p->FoToMainUnpackSizeIndex[folderIndex]
      || outSize != SzAr_GetFolderUnpackSize(p, folderIndex))
    return SZ_ERROR_FAIL;
  {
    unsigned i;
    Byte *tempBuf[3] = { 0, 0, 0};

    res = SzFolder_Decode2(&folder, data,
        &p->CoderUnpackSizes[p->FoToCoderUnpackSizes[folderIndex]],
        p->PackPositions + p->FoStartPackStreamIndex[folderIndex],
        inStream, startPos,
        outBuffer, (SizeT)outSize, allocMain, tempBuf);
    
    for (i = 0; i < 3; i++)
      IAlloc_Free(allocMain, tempBuf[i]);

    if (res == SZ_OK)
      if (SzBitWithVals_Check(&p->FolderCRCs, folderIndex))
        if (CrcCalc(outBuffer, outSize) != p->FolderCRCs.Vals[folderIndex])
          res = SZ_ERROR_CRC;

    return res;
  }
}